

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O2

void __thiscall
Liby::BlockingQueue<std::function<void_()>_>::push_back
          (BlockingQueue<std::function<void_()>_> *this,const_reference_type e)

{
  std::mutex::lock(&this->mutex_);
  std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>const&>
            ((list<std::function<void()>,std::allocator<std::function<void()>>> *)&this->queue_,e);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void push_back(const_reference_type e) {
        std::lock_guard<std::mutex> G_(mutex_);
        queue_.emplace_back(e);
    }